

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall clipp::parameter::parameter(parameter *this,match_predicate *filter)

{
  predicate_adapter *in_RSI;
  action_provider<clipp::parameter> *in_RDI;
  match_predicate *__x;
  function<clipp::subrange_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  
  detail::token<clipp::parameter>::token((token<clipp::parameter> *)in_RDI);
  detail::action_provider<clipp::parameter>::action_provider(in_RDI);
  __x = (match_predicate *)
        &in_RDI[1].repeatActions_.
         super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[1].repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[1].missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[1].missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x188c76);
  this_00 = (function<clipp::subrange_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&in_RDI[1].missingActions_.
                super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_RDI,__x);
  predicate_adapter::predicate_adapter((predicate_adapter *)in_RDI,__x);
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>(this_00,in_RSI);
  predicate_adapter::~predicate_adapter((predicate_adapter *)0x188cc6);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x188cd0);
  std::__cxx11::string::string((string *)&in_RDI[1].conflictActions_);
  *(undefined1 *)
   &in_RDI[2].argActions_.
    super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].argActions_.
           super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  return;
}

Assistant:

explicit
    parameter(match_predicate filter):
        flags_{},
        matcher_{predicate_adapter{std::move(filter)}},
        label_{}, required_{false}, greedy_{false}
    {}